

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs-event.c
# Opt level: O1

int run_test_fs_event_start_and_close(void)

{
  char *__s;
  size_t sVar1;
  int iVar2;
  uv_fs_event_t *puVar3;
  uv_fs_event_t *puVar4;
  undefined8 uVar5;
  size_t sVar6;
  undefined8 uVar7;
  int in_ECX;
  int extraout_EDX;
  long lVar8;
  code *__s1;
  undefined8 in_R8;
  undefined8 in_R9;
  uv_fs_event_t fs_event2;
  uv_fs_event_t fs_event1;
  size_t sStack_570;
  char acStack_568 [1032];
  uv_fs_event_t *puStack_160;
  uv_fs_event_t local_120;
  uv_fs_event_t local_98;
  
  puVar3 = (uv_fs_event_t *)uv_default_loop();
  create_dir("watch_dir");
  __s1 = (code *)&local_98;
  puVar4 = puVar3;
  iVar2 = uv_fs_event_init();
  if (iVar2 == 0) {
    __s1 = fs_event_cb_dir;
    puVar4 = &local_98;
    in_ECX = 0;
    iVar2 = uv_fs_event_start(puVar4,fs_event_cb_dir,"watch_dir");
    if (iVar2 != 0) goto LAB_001519b7;
    __s1 = (code *)&local_120;
    puVar4 = puVar3;
    iVar2 = uv_fs_event_init();
    if (iVar2 != 0) goto LAB_001519bc;
    __s1 = fs_event_cb_dir;
    puVar4 = &local_120;
    in_ECX = 0;
    iVar2 = uv_fs_event_start(puVar4,fs_event_cb_dir,"watch_dir");
    if (iVar2 != 0) goto LAB_001519c1;
    uv_close(&local_120,close_cb);
    uv_close(&local_98);
    __s1 = (code *)0x0;
    puVar4 = puVar3;
    uv_run();
    if (close_cb_called != 2) goto LAB_001519c6;
    remove("watch_dir/");
    puVar3 = (uv_fs_event_t *)uv_default_loop();
    uv_walk(puVar3,close_walk_cb,0);
    __s1 = (code *)0x0;
    uv_run(puVar3);
    puVar4 = (uv_fs_event_t *)uv_default_loop();
    iVar2 = uv_loop_close();
    if (iVar2 == 0) {
      return 0;
    }
  }
  else {
    run_test_fs_event_start_and_close_cold_1();
LAB_001519b7:
    run_test_fs_event_start_and_close_cold_2();
LAB_001519bc:
    run_test_fs_event_start_and_close_cold_3();
LAB_001519c1:
    run_test_fs_event_start_and_close_cold_4();
LAB_001519c6:
    run_test_fs_event_start_and_close_cold_5();
  }
  run_test_fs_event_start_and_close_cold_6();
  fs_event_cb_called = fs_event_cb_called + 1;
  if (puVar4 == &fs_event) {
    if (in_ECX != 0) goto LAB_00151a2b;
    if (extraout_EDX != 2) goto LAB_00151a30;
    iVar2 = strcmp((char *)__s1,"file1");
    if (iVar2 != 0) goto LAB_00151a35;
    iVar2 = uv_fs_event_stop(&fs_event);
    if (iVar2 == 0) {
      iVar2 = uv_close(&fs_event,close_cb);
      return iVar2;
    }
  }
  else {
    fs_event_cb_dir_cold_1();
LAB_00151a2b:
    fs_event_cb_dir_cold_2();
LAB_00151a30:
    fs_event_cb_dir_cold_3();
LAB_00151a35:
    fs_event_cb_dir_cold_4();
  }
  fs_event_cb_dir_cold_5();
  puStack_160 = puVar3;
  uVar5 = uv_default_loop();
  create_dir("watch_dir");
  create_dir("watch_dir/subfolder");
  lVar8 = 0;
  do {
    iVar2 = uv_fs_event_init(uVar5,&fs_event);
    if (iVar2 != 0) {
LAB_00151c34:
      run_test_fs_event_getpath_cold_1();
      goto LAB_00151c39;
    }
    sStack_570 = 0x400;
    iVar2 = uv_fs_event_getpath(&fs_event,acStack_568,&sStack_570);
    if (iVar2 != -0x16) {
LAB_00151c2f:
      run_test_fs_event_getpath_cold_2();
      goto LAB_00151c34;
    }
    __s = *(char **)((long)&DAT_001c8ca0 + lVar8);
    iVar2 = uv_fs_event_start(&fs_event,fail_cb,__s,0);
    if (iVar2 != 0) {
LAB_00151c2a:
      run_test_fs_event_getpath_cold_3();
      goto LAB_00151c2f;
    }
    sStack_570 = 0;
    iVar2 = uv_fs_event_getpath(&fs_event,acStack_568,&sStack_570);
    sVar1 = sStack_570;
    if (iVar2 != -0x69) {
LAB_00151c25:
      run_test_fs_event_getpath_cold_4();
      goto LAB_00151c2a;
    }
    if (0x3ff < sStack_570) {
LAB_00151c20:
      run_test_fs_event_getpath_cold_5();
      goto LAB_00151c25;
    }
    sVar6 = strlen(__s);
    if (sVar1 != sVar6 + 1) {
LAB_00151c1b:
      run_test_fs_event_getpath_cold_6();
      goto LAB_00151c20;
    }
    iVar2 = uv_fs_event_getpath(&fs_event,acStack_568,&sStack_570);
    sVar1 = sStack_570;
    if (iVar2 != 0) {
LAB_00151c16:
      run_test_fs_event_getpath_cold_7();
      goto LAB_00151c1b;
    }
    sVar6 = strlen(__s);
    if (sVar1 != sVar6) {
LAB_00151c11:
      run_test_fs_event_getpath_cold_8();
      goto LAB_00151c16;
    }
    iVar2 = strcmp(acStack_568,__s);
    if (iVar2 != 0) {
LAB_00151c0c:
      run_test_fs_event_getpath_cold_9();
      goto LAB_00151c11;
    }
    iVar2 = uv_fs_event_stop(&fs_event);
    if (iVar2 != 0) {
LAB_00151c07:
      run_test_fs_event_getpath_cold_10();
      goto LAB_00151c0c;
    }
    uv_close(&fs_event,close_cb);
    uv_run(uVar5,0);
    if (close_cb_called != 1) {
      run_test_fs_event_getpath_cold_11();
      goto LAB_00151c07;
    }
    close_cb_called = 0;
    lVar8 = lVar8 + 8;
  } while (lVar8 != 0x28);
  remove("watch_dir/");
  uVar5 = uv_default_loop();
  uv_walk(uVar5,close_walk_cb,0);
  uv_run(uVar5,0);
  uVar5 = uv_default_loop();
  iVar2 = uv_loop_close(uVar5);
  if (iVar2 == 0) {
    return 0;
  }
LAB_00151c39:
  run_test_fs_event_getpath_cold_12();
  uVar5 = uv_default_loop();
  uv_walk(uVar5,close_walk_cb,0);
  uv_run(uVar5,0);
  uVar7 = uv_default_loop();
  iVar2 = uv_loop_close(uVar7);
  if (iVar2 == 0) {
    return 0;
  }
  run_test_fs_event_error_reporting_cold_1();
  puVar4 = (uv_fs_event_t *)uv_default_loop();
  iVar2 = uv_fs_event_init(puVar4,&fs_event);
  if (iVar2 == 0) {
    puVar4 = &fs_event;
    iVar2 = uv_fs_event_start(&fs_event,fs_event_cb_file,"<:;",0,in_R8,in_R9,uVar5);
    if (iVar2 == 0) goto LAB_00151d36;
    puVar4 = &fs_event;
    iVar2 = uv_is_active(&fs_event);
    if (iVar2 != 0) goto LAB_00151d3b;
    puVar4 = &fs_event;
    iVar2 = uv_fs_event_start(&fs_event,fs_event_cb_file,"",0,in_R8,in_R9,uVar5);
    if (iVar2 == 0) goto LAB_00151d40;
    puVar4 = &fs_event;
    iVar2 = uv_is_active(&fs_event);
    if (iVar2 == 0) {
      uVar5 = uv_default_loop();
      uv_walk(uVar5,close_walk_cb,0);
      uv_run(uVar5,0);
      puVar4 = (uv_fs_event_t *)uv_default_loop();
      iVar2 = uv_loop_close(puVar4);
      if (iVar2 == 0) {
        return 0;
      }
      goto LAB_00151d4a;
    }
  }
  else {
    run_test_fs_event_watch_invalid_path_cold_1();
LAB_00151d36:
    run_test_fs_event_watch_invalid_path_cold_6();
LAB_00151d3b:
    run_test_fs_event_watch_invalid_path_cold_2();
LAB_00151d40:
    run_test_fs_event_watch_invalid_path_cold_5();
  }
  run_test_fs_event_watch_invalid_path_cold_3();
LAB_00151d4a:
  run_test_fs_event_watch_invalid_path_cold_4();
  iVar2 = uv_is_closing();
  if (iVar2 != 0) {
    return iVar2;
  }
  iVar2 = uv_close(puVar4,0);
  return iVar2;
}

Assistant:

TEST_IMPL(fs_event_start_and_close) {
#if defined(NO_FS_EVENTS)
  RETURN_SKIP(NO_FS_EVENTS);
#endif
  uv_loop_t* loop;
  uv_fs_event_t fs_event1;
  uv_fs_event_t fs_event2;
  int r;

  loop = uv_default_loop();

  create_dir("watch_dir");

  r = uv_fs_event_init(loop, &fs_event1);
  ASSERT(r == 0);
  r = uv_fs_event_start(&fs_event1, fs_event_cb_dir, "watch_dir", 0);
  ASSERT(r == 0);

  r = uv_fs_event_init(loop, &fs_event2);
  ASSERT(r == 0);
  r = uv_fs_event_start(&fs_event2, fs_event_cb_dir, "watch_dir", 0);
  ASSERT(r == 0);

  uv_close((uv_handle_t*) &fs_event2, close_cb);
  uv_close((uv_handle_t*) &fs_event1, close_cb);

  uv_run(loop, UV_RUN_DEFAULT);

  ASSERT(close_cb_called == 2);

  remove("watch_dir/");
  MAKE_VALGRIND_HAPPY();
  return 0;
}